

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O1

int isequal(attr *a,attr *b)

{
  array_t *paVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int d2 [10];
  int d1 [10];
  int local_68 [12];
  int aiStack_38 [12];
  
  iVar3 = 0;
  if (b != (attr *)0x0 && a != (attr *)0x0) {
    lVar5 = 0;
    uVar4 = 0;
    iVar2 = a->kind;
    while (iVar2 == 1) {
      paVar1 = (a->field_1).array;
      aiStack_38[uVar4] = paVar1->size;
      a = paVar1->type;
      uVar4 = uVar4 + 1;
      iVar2 = a->kind;
    }
    iVar7 = b->kind;
    if (iVar7 == 1) {
      lVar5 = 0;
      do {
        paVar1 = (b->field_1).array;
        local_68[lVar5] = paVar1->size;
        b = paVar1->type;
        lVar5 = lVar5 + 1;
        iVar7 = b->kind;
      } while (iVar7 == 1);
    }
    iVar3 = 0;
    if ((int)uVar4 == (int)lVar5) {
      if ((int)uVar4 != 0) {
        uVar6 = 0;
        do {
          if (aiStack_38[uVar6] != local_68[uVar6]) {
            return 0;
          }
          uVar6 = uVar6 + 1;
        } while ((uVar4 & 0xffffffff) != uVar6);
      }
      if (iVar2 == 3) {
        a = ((a->field_1).function)->return_type;
      }
      if (iVar7 == 3) {
        b = ((b->field_1).function)->return_type;
      }
      if (a->kind == b->kind) {
        switch(a->kind) {
        case 0:
          if (((a->field_1).basic)->type != ((b->field_1).basic)->type) {
            return 0;
          }
          break;
        case 1:
        case 3:
          break;
        case 2:
          iVar3 = strcmp(((a->field_1).basic)->name,((b->field_1).basic)->name);
          if (iVar3 != 0) {
            return 0;
          }
          break;
        default:
          abort();
        }
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int isequal(struct attr *a, struct attr *b) {
    if (!a || !b)
        return 0;
    int d1[10], d2[10];
    int depth1 = 0, depth2 = 0;
    for (; a->kind == ARRAY; ++depth1) {
        d1[depth1] = a->array->size;
        a = a->array->type;
    }
    for (; b->kind == ARRAY; ++depth2) {
        d2[depth2] = b->array->size;
        b = b->array->type;
    }
    if (depth1 != depth2)
        return 0;
    int i;
    for (i = 0; i < depth1; ++i) {
        if (d1[i] != d2[i])
            return 0;
    }
    if (a->kind == FUNCTION)
        a = a->function->return_type;
    if (b->kind == FUNCTION) {
        b = b->function->return_type;
    }
    //DONETODO: check type equality
    if (a->kind != b->kind)
        return 0;
    switch (a->kind) {
        case BASIC:
            if (a->basic->type != b->basic->type)
                return 0;
            break;
        case STRUCTURE:
            if (strcmp(a->structure->name, b->structure->name) != 0) {
                return 0;
            }
            break;
        case ARRAY:
            break;
        case FUNCTION:
            break;
        default:
            abort();
    }
    return 1;
}